

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void xml_node_free(xml_node *node)

{
  xml_node **local_20;
  xml_node **it;
  xml_attribute **at;
  xml_node *node_local;
  
  xml_string_free(node->name);
  if (node->content != (xml_string *)0x0) {
    xml_string_free(node->content);
  }
  for (it = (xml_node **)node->attributes; *it != (xml_node *)0x0; it = it + 1) {
    xml_attribute_free((xml_attribute *)*it);
  }
  free(node->attributes);
  for (local_20 = node->children; *local_20 != (xml_node *)0x0; local_20 = local_20 + 1) {
    xml_node_free(*local_20);
  }
  free(node->children);
  free(node);
  return;
}

Assistant:

static void xml_node_free(struct xml_node* node) {
	xml_string_free(node->name);

	if (node->content) {
		xml_string_free(node->content);
	}

	struct xml_attribute** at = node->attributes;
	while(*at) {
		xml_attribute_free(*at);
		++at;
	}
	free(node->attributes);

	struct xml_node** it = node->children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(node->children);

	free(node);
}